

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
                  *matrixToCopy,Column_settings *colSettings)

{
  size_type sVar1;
  size_t sVar2;
  type *ptVar3;
  type *ptVar4;
  undefined4 uVar5;
  ulong uVar6;
  Column_settings *pCVar7;
  Field_operators *pFVar8;
  __hashtable *__this;
  __node_base *p_Var9;
  double dVar10;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_unsigned_int>,_false>_>_>
  local_38;
  
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_bucket_count =
       (matrixToCopy->super_RU_vine_swap_option).super_type.map_._M_h._M_bucket_count;
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_element_count =
       (matrixToCopy->super_RU_vine_swap_option).super_type.map_._M_h._M_element_count;
  ptVar3 = &(matrixToCopy->super_RU_vine_swap_option).super_type;
  uVar5 = *(undefined4 *)&(ptVar3->map_)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (matrixToCopy->super_RU_vine_swap_option).super_type.map_._M_h._M_rehash_policy.
          _M_next_resize;
  ptVar4 = &(this->super_RU_vine_swap_option).super_type;
  (ptVar4->map_)._M_h._M_rehash_policy._M_max_load_factor =
       (ptVar3->map_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(ptVar4->map_)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->super_RU_vine_swap_option).super_type.map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_38._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_int>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this,(_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)matrixToCopy,&local_38);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&(this->super_RU_representative_cycles_option).representativeCycles_,
           &(matrixToCopy->super_RU_representative_cycles_option).representativeCycles_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->super_RU_representative_cycles_option).birthToCycle_,
             &(matrixToCopy->super_RU_representative_cycles_option).birthToCycle_);
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
  ::Base_swap(&(this->reducedMatrixR_).
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_false>_>_>_>
              ,&(matrixToCopy->reducedMatrixR_).
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_false>_>_>_>
             );
  (this->reducedMatrixR_).matrix_._M_h._M_buckets =
       &(this->reducedMatrixR_).matrix_._M_h._M_single_bucket;
  (this->reducedMatrixR_).matrix_._M_h._M_bucket_count = 1;
  (this->reducedMatrixR_).matrix_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reducedMatrixR_).matrix_._M_h._M_element_count = 0;
  (this->reducedMatrixR_).matrix_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reducedMatrixR_).matrix_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reducedMatrixR_).matrix_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->reducedMatrixR_).nextInsertIndex_ = (matrixToCopy->reducedMatrixR_).nextInsertIndex_;
  pCVar7 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    pCVar7 = (matrixToCopy->reducedMatrixR_).colSettings_;
  }
  (this->reducedMatrixR_).colSettings_ = pCVar7;
  sVar1 = (matrixToCopy->reducedMatrixR_).matrix_._M_h._M_element_count;
  dVar10 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  uVar6 = (ulong)dVar10;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->reducedMatrixR_).matrix_._M_h,
           (long)(dVar10 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  p_Var9 = &(matrixToCopy->reducedMatrixR_).matrix_._M_h._M_before_begin;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
    ::_container_insert(&this->reducedMatrixR_,(Column *)(p_Var9 + 2),
                        (Index)*(size_type *)(p_Var9 + 1));
  }
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>
  ::Base_swap(&(this->mirrorMatrixU_).
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_false>_>_>_>
              ,&(matrixToCopy->mirrorMatrixU_).
                super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_false>_>_>_>
             );
  (this->mirrorMatrixU_).matrix_._M_h._M_buckets =
       &(this->mirrorMatrixU_).matrix_._M_h._M_single_bucket;
  (this->mirrorMatrixU_).matrix_._M_h._M_bucket_count = 1;
  (this->mirrorMatrixU_).matrix_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mirrorMatrixU_).matrix_._M_h._M_element_count = 0;
  (this->mirrorMatrixU_).matrix_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mirrorMatrixU_).matrix_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mirrorMatrixU_).matrix_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mirrorMatrixU_).nextInsertIndex_ = (matrixToCopy->mirrorMatrixU_).nextInsertIndex_;
  pCVar7 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    pCVar7 = (matrixToCopy->mirrorMatrixU_).colSettings_;
  }
  (this->mirrorMatrixU_).colSettings_ = pCVar7;
  sVar1 = (matrixToCopy->mirrorMatrixU_).matrix_._M_h._M_element_count;
  dVar10 = ((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  uVar6 = (ulong)dVar10;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->mirrorMatrixU_).matrix_._M_h,
           (long)(dVar10 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  p_Var9 = &(matrixToCopy->mirrorMatrixU_).matrix_._M_h._M_before_begin;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
    ::_container_insert(&this->mirrorMatrixU_,(Column *)(p_Var9 + 2),
                        (Index)*(size_type *)(p_Var9 + 1));
  }
  local_38._M_h = (__hashtable_alloc *)&this->pivotToColumnIndex_;
  (this->pivotToColumnIndex_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->pivotToColumnIndex_)._M_h._M_bucket_count =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_bucket_count;
  (this->pivotToColumnIndex_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pivotToColumnIndex_)._M_h._M_element_count =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_element_count;
  uVar5 = *(undefined4 *)&(matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->pivotToColumnIndex_)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->pivotToColumnIndex_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_int>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_38._M_h,&(matrixToCopy->pivotToColumnIndex_)._M_h,&local_38);
  this->nextEventIndex_ = matrixToCopy->nextEventIndex_;
  if (colSettings == (Column_settings *)0x0) {
    pFVar8 = matrixToCopy->operators_;
  }
  else {
    pFVar8 = (Field_operators *)0x0;
  }
  this->operators_ = pFVar8;
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const RU_matrix& matrixToCopy, Column_settings* colSettings)
    : Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      reducedMatrixR_(matrixToCopy.reducedMatrixR_, colSettings),
      mirrorMatrixU_(matrixToCopy.mirrorMatrixU_, colSettings),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextEventIndex_(matrixToCopy.nextEventIndex_),
      operators_(colSettings == nullptr ? matrixToCopy.operators_ : nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }
}